

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidSubMessage<proto2_unittest::TestAllTypes>::TestBody
          (InvalidSubMessage<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_5b8;
  AssertHelper local_598;
  Message local_590;
  string local_588;
  string_view local_568;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_520;
  Message local_518;
  string local_510;
  string_view local_4f0;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4a8;
  Message local_4a0;
  string local_498;
  string_view local_478;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_430;
  Message local_428;
  string local_420;
  string_view local_400;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_3b8;
  Message local_3b0 [3];
  string local_398;
  string_view local_378;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_;
  TestAllTypes message;
  InvalidSubMessage<proto2_unittest::TestAllTypes> *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&gtest_ar_.message_);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_398,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_37cdd0 + 5,0);
  local_378 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_398);
  local_361 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_378);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_360,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\", 0))","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_420,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"",1)
  ;
  local_400 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_420);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_400);
  local_3e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_3e8,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\0\", 1))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_498,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_30c814,1);
  local_478 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_498);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_478);
  local_461 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_460,&local_461,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_460,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\200\", 1))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x563,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_510,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"\f",
             1);
  local_4f0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_510);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_4f0);
  local_4d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_510);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_4d8,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\014\", 1))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x567,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_588,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             "\x0f",1);
  local_568 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_588);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_568);
  local_551 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_550,&local_551,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_588);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)local_550,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\017\", 1))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x56b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&local_5b8);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidSubMessage) {
  typename TestFixture::TestAllTypes message;

  // Control case.
  EXPECT_TRUE(message.ParseFromString(this->MakeInvalidEmbeddedMessage("", 0)));

  // The byte is a valid varint, but not a valid tag (zero).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\0", 1)));

  // The byte is a malformed varint.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\200", 1)));

  // The byte is an endgroup tag, but we aren't parsing a group.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\014", 1)));

  // The byte is a valid varint but not a valid tag (bad wire type).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\017", 1)));
}